

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_warp_plane_sse4.c
# Opt level: O1

void av1_highbd_warp_affine_sse4_1
               (int32_t *mat,uint16_t *ref,int width,int height,int stride,uint16_t *pred,int p_col,
               int p_row,int p_width,int p_height,int p_stride,int subsampling_x,int subsampling_y,
               int bd,ConvolveParams *conv_params,int16_t alpha,int16_t beta,int16_t gamma,
               int16_t delta)

{
  WarpedFilterCoeff aWVar1 [8];
  WarpedFilterCoeff aWVar2 [8];
  WarpedFilterCoeff aWVar3 [8];
  WarpedFilterCoeff aWVar4 [8];
  int iVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [12];
  undefined1 auVar42 [12];
  byte bVar43;
  byte bVar44;
  int iVar45;
  int iVar46;
  int iVar47;
  int iVar48;
  int iVar49;
  undefined4 uVar50;
  undefined4 uVar51;
  undefined4 uVar52;
  undefined4 uVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  byte bVar62;
  uint uVar63;
  int iVar64;
  uint uVar65;
  int iVar66;
  int iVar67;
  long lVar68;
  long lVar69;
  ulong uVar70;
  int iVar71;
  int iVar72;
  long lVar73;
  int iVar74;
  int iVar75;
  uint uVar76;
  int iVar77;
  long lVar78;
  int iVar79;
  int iVar80;
  int iVar81;
  long lVar82;
  int iVar83;
  int iVar84;
  int iVar85;
  int iVar86;
  int iVar87;
  int iVar88;
  uint uVar89;
  int iVar90;
  long lVar91;
  undefined1 (*pauVar92) [16];
  uint16_t *puVar93;
  int iVar94;
  long lVar95;
  undefined2 *puVar96;
  int iVar97;
  int iVar98;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  int iVar135;
  int iVar144;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  int iVar145;
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  __m128i src_1;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  ushort uVar185;
  short sVar186;
  ushort uVar203;
  ushort uVar205;
  ushort uVar207;
  ushort uVar209;
  ushort uVar210;
  ushort uVar211;
  undefined1 auVar188 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  ushort uVar212;
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  short sVar204;
  short sVar206;
  short sVar208;
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  int iVar213;
  int iVar225;
  int iVar226;
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  int iVar227;
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  __m128i tmp [15];
  int local_318;
  int local_2f4;
  undefined8 uStack_230;
  short local_178;
  short sStack_176;
  undefined8 uStack_150;
  undefined1 local_148 [16];
  undefined1 local_128 [16];
  undefined2 local_118 [16];
  undefined2 local_f8 [16];
  undefined2 local_d8 [16];
  undefined2 local_b8 [68];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar189 [16];
  undefined8 uVar187;
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  
  uVar76 = conv_params->round_0;
  if (conv_params->is_compound == 0) {
    uVar89 = 0xe - uVar76;
  }
  else {
    uVar89 = conv_params->round_1;
  }
  uVar65 = 0xff;
  if (bd == 0xc) {
    uVar65 = 0xfff;
  }
  uVar63 = 0x3ff;
  if (bd != 10) {
    uVar63 = uVar65;
  }
  if (0 < p_height) {
    iVar71 = conv_params->round_1 + uVar76;
    uVar65 = 0xe - iVar71;
    auVar99 = ZEXT416(uVar65);
    bVar62 = (byte)bd;
    bVar43 = (bVar62 + 0xe) - (char)iVar71;
    bVar44 = (byte)uVar76;
    iVar72 = (1 << ((byte)uVar89 & 0x1f)) >> 1;
    iVar98 = (int)alpha;
    iVar97 = (int)beta;
    iVar75 = (int)gamma;
    iVar87 = 1 << ((bVar44 ^ 0xff) + bVar62 + 7 & 0x1f);
    iVar94 = ((1 << (bVar44 & 0x1f)) >> 1) + (1 << (bVar62 + 6 & 0x1f));
    auVar100 = ZEXT416(uVar76);
    auVar125 = ZEXT416(uVar89);
    iVar79 = (-1 << ((bVar62 + (byte)uVar89) - 1 & 0x1f)) + iVar72;
    auVar126 = pshuflw(ZEXT416(uVar63),ZEXT416(uVar63),0);
    iVar71 = conv_params->fwd_offset;
    iVar5 = conv_params->bck_offset;
    iVar135 = (-1 << (bVar43 & 0x1f)) + (-1 << (bVar43 - 1 & 0x1f)) +
              ((1 << ((byte)uVar65 & 0x1f)) >> 1);
    iVar72 = iVar72 + (1 << ((bVar62 + 0xe) - bVar44 & 0x1f));
    iVar66 = iVar97 * -3 + 0x10200;
    iVar45 = iVar98 * 7;
    iVar64 = height + -1;
    lVar95 = (long)height;
    auVar165._4_4_ = iVar135;
    auVar165._0_4_ = iVar135;
    auVar165._8_4_ = iVar135;
    auVar165._12_4_ = iVar135;
    auVar101._4_4_ = iVar79;
    auVar101._0_4_ = iVar79;
    auVar101._8_4_ = iVar79;
    auVar101._12_4_ = iVar79;
    auVar101 = pshuflw(auVar101,ZEXT416(-1 << (bVar62 & 0x1f) ^ 0xffffffff),0);
    local_148._0_4_ = auVar101._0_4_;
    local_148._4_4_ = local_148._0_4_;
    local_148._8_4_ = local_148._0_4_;
    local_148._12_4_ = local_148._0_4_;
    iVar49 = iVar98 * 2;
    iVar80 = iVar98 * 4;
    iVar46 = iVar98 * 6;
    iVar47 = iVar98 * 3;
    iVar48 = iVar98 * 5;
    local_318 = 0;
    iVar86 = 0;
    iVar81 = p_height;
    do {
      lVar82 = (long)iVar81;
      if (7 < lVar82) {
        lVar82 = 8;
      }
      if (lVar82 < -5) {
        lVar82 = -6;
      }
      if (0 < p_width) {
        lVar82 = lVar82 + 7;
        bVar43 = (byte)subsampling_y & 0x1f;
        lVar68 = (long)(p_row + 4 + iVar86 << bVar43);
        iVar83 = p_height - iVar86;
        iVar67 = 8;
        if (iVar83 < 8) {
          iVar67 = iVar83;
        }
        lVar73 = (long)iVar67;
        iVar88 = 0 << bVar43;
        local_2f4 = local_318;
        do {
          lVar91 = (long)(p_col + 4 + iVar88 << ((byte)subsampling_x & 0x1f));
          lVar78 = (long)*mat + mat[3] * lVar68 + mat[2] * lVar91 >> ((byte)subsampling_x & 0x3f);
          lVar91 = (long)mat[1] + mat[5] * lVar68 + mat[4] * lVar91 >> ((byte)subsampling_y & 0x3f);
          iVar90 = (int)((ulong)lVar78 >> 0x10);
          iVar77 = (int)((ulong)lVar91 >> 0x10);
          if (iVar90 < -6) {
            if (-7 < iVar83) {
              lVar78 = -7;
              pauVar92 = &local_128;
              do {
                iVar90 = iVar77 + (int)lVar78;
                if (lVar95 <= iVar77 + lVar78) {
                  iVar90 = iVar64;
                }
                if (iVar77 + lVar78 < 0) {
                  iVar90 = 0;
                }
                auVar101 = ZEXT416(((uint)ref[iVar90 * stride] << (7 - bVar44 & 0x1f)) + iVar87);
                auVar101 = pshuflw(auVar101,auVar101,0);
                auVar102._0_4_ = auVar101._0_4_;
                auVar102._4_4_ = auVar102._0_4_;
                auVar102._8_4_ = auVar102._0_4_;
                auVar102._12_4_ = auVar102._0_4_;
                *pauVar92 = auVar102;
                lVar78 = lVar78 + 1;
                pauVar92 = pauVar92 + 1;
              } while (lVar78 < lVar73);
            }
          }
          else if (iVar90 < width + 6) {
            uVar76 = ((uint)lVar78 & 0xfffc) + (iVar98 + iVar97) * -4 & 0xffffffc0;
            if (width < iVar90 + 9 || iVar90 < 7) {
              if (-7 < iVar83) {
                uVar89 = (iVar90 - width) + 8;
                iVar74 = uVar76 + iVar66;
                lVar78 = -7;
                pauVar92 = &local_128;
                do {
                  iVar84 = iVar77 + (int)lVar78;
                  if (lVar95 <= iVar77 + lVar78) {
                    iVar84 = iVar64;
                  }
                  if (iVar77 + lVar78 < 0) {
                    iVar84 = 0;
                  }
                  auVar134 = pshufb(*(undefined1 (*) [16])
                                     (ref + (long)iVar90 + (long)(iVar84 * stride) + -7),
                                    _DAT_00516da0);
                  auVar101 = pshufb(*(undefined1 (*) [16])
                                     (ref + (long)iVar90 + (long)(iVar84 * stride) + 1),
                                    _DAT_00516da0);
                  auVar214._0_8_ = auVar134._0_8_;
                  auVar214._8_8_ = auVar101._0_8_;
                  auVar111._8_8_ = auVar101._8_8_;
                  auVar111._0_8_ = auVar134._8_8_;
                  if (iVar90 < 7) {
                    auVar214 = pshufb(auVar214,(undefined1  [16])warp_pad_left[6 - iVar90]);
                    auVar111 = pshufb(auVar111,(undefined1  [16])warp_pad_left[6 - iVar90]);
                  }
                  if (-1 < (int)uVar89) {
                    auVar214 = pshufb(auVar214,(undefined1  [16])warp_pad_right[uVar89]);
                    auVar111 = pshufb(auVar111,(undefined1  [16])warp_pad_right[uVar89]);
                  }
                  auVar195._0_14_ = auVar214._0_14_;
                  auVar195[0xe] = auVar214[7];
                  auVar195[0xf] = auVar111[7];
                  auVar194._14_2_ = auVar195._14_2_;
                  auVar194._0_13_ = auVar214._0_13_;
                  auVar194[0xd] = auVar111[6];
                  auVar193._13_3_ = auVar194._13_3_;
                  auVar193._0_12_ = auVar214._0_12_;
                  auVar193[0xc] = auVar214[6];
                  auVar192._12_4_ = auVar193._12_4_;
                  auVar192._0_11_ = auVar214._0_11_;
                  auVar192[0xb] = auVar111[5];
                  auVar191._11_5_ = auVar192._11_5_;
                  auVar191._0_10_ = auVar214._0_10_;
                  auVar191[10] = auVar214[5];
                  auVar190._10_6_ = auVar191._10_6_;
                  auVar190._0_9_ = auVar214._0_9_;
                  auVar190[9] = auVar111[4];
                  auVar189._9_7_ = auVar190._9_7_;
                  auVar189._0_8_ = auVar214._0_8_;
                  auVar189[8] = auVar214[4];
                  auVar188._8_8_ = auVar189._8_8_;
                  auVar188[7] = auVar111[3];
                  auVar188[6] = auVar214[3];
                  auVar188[5] = auVar111[2];
                  auVar188[4] = auVar214[2];
                  auVar188[3] = auVar111[1];
                  auVar188[2] = auVar214[1];
                  auVar188[0] = auVar214[0];
                  auVar188[1] = auVar111[0];
                  auVar215[1] = auVar111[8];
                  auVar215[0] = auVar214[8];
                  auVar215[2] = auVar214[9];
                  auVar215[3] = auVar111[9];
                  auVar215[4] = auVar214[10];
                  auVar215[5] = auVar111[10];
                  auVar215[6] = auVar214[0xb];
                  auVar215[7] = auVar111[0xb];
                  auVar215[8] = auVar214[0xc];
                  auVar215[9] = auVar111[0xc];
                  auVar215[10] = auVar214[0xd];
                  auVar215[0xb] = auVar111[0xd];
                  auVar215[0xc] = auVar214[0xe];
                  auVar215[0xd] = auVar111[0xe];
                  auVar215[0xe] = auVar214[0xf];
                  auVar215[0xf] = auVar111[0xf];
                  aWVar1 = av1_warped_filter[iVar74 >> 10];
                  iVar84 = iVar49 + iVar74 >> 10;
                  aWVar2 = av1_warped_filter[iVar80 + iVar74 >> 10];
                  iVar85 = iVar46 + iVar74 >> 10;
                  auVar146._0_8_ = aWVar1._0_8_;
                  auVar146._8_4_ = aWVar1._4_4_;
                  auVar146._12_4_ = *(undefined4 *)(av1_warped_filter[iVar84] + 2);
                  auVar228._4_4_ = *(undefined4 *)av1_warped_filter[iVar84];
                  auVar228._0_4_ = aWVar1._0_4_;
                  auVar155._0_8_ = aWVar2._0_8_;
                  auVar155._8_4_ = aWVar2._4_4_;
                  auVar155._12_4_ = *(undefined4 *)(av1_warped_filter[iVar85] + 2);
                  auVar228._12_4_ = *(undefined4 *)av1_warped_filter[iVar85];
                  auVar228._8_4_ = aWVar2._0_4_;
                  auVar235._0_8_ =
                       CONCAT44(*(undefined4 *)(av1_warped_filter[iVar84] + 4),aWVar1._8_4_);
                  auVar235._8_4_ = aWVar1._12_4_;
                  auVar235._12_4_ = *(undefined4 *)(av1_warped_filter[iVar84] + 6);
                  auVar112._0_8_ =
                       CONCAT44(*(undefined4 *)(av1_warped_filter[iVar85] + 4),aWVar2._8_4_);
                  auVar112._8_4_ = aWVar2._12_4_;
                  auVar112._12_4_ = *(undefined4 *)(av1_warped_filter[iVar85] + 6);
                  auVar147._8_8_ = auVar155._8_8_;
                  auVar147._0_8_ = auVar146._8_8_;
                  auVar174._8_8_ = auVar112._0_8_;
                  auVar174._0_8_ = auVar235._0_8_;
                  auVar236._8_8_ = auVar112._8_8_;
                  auVar236._0_8_ = auVar235._8_8_;
                  aWVar1 = av1_warped_filter[iVar98 + iVar74 >> 10];
                  iVar84 = iVar47 + iVar74 >> 10;
                  aWVar2 = av1_warped_filter[iVar48 + iVar74 >> 10];
                  iVar85 = iVar45 + iVar74 >> 10;
                  auVar136._0_8_ = aWVar1._0_8_;
                  auVar136._8_4_ = aWVar1._4_4_;
                  auVar136._12_4_ = *(undefined4 *)(av1_warped_filter[iVar84] + 2);
                  auVar103._4_4_ = *(undefined4 *)av1_warped_filter[iVar84];
                  auVar103._0_4_ = aWVar1._0_4_;
                  auVar167._0_8_ = aWVar2._0_8_;
                  auVar167._8_4_ = aWVar2._4_4_;
                  auVar167._12_4_ = *(undefined4 *)(av1_warped_filter[iVar85] + 2);
                  auVar103._12_4_ = *(undefined4 *)av1_warped_filter[iVar85];
                  auVar103._8_4_ = aWVar2._0_4_;
                  auVar113._0_8_ =
                       CONCAT44(*(undefined4 *)(av1_warped_filter[iVar84] + 4),aWVar1._8_4_);
                  auVar113._8_4_ = aWVar1._12_4_;
                  auVar113._12_4_ = *(undefined4 *)(av1_warped_filter[iVar84] + 6);
                  auVar127._0_8_ =
                       CONCAT44(*(undefined4 *)(av1_warped_filter[iVar85] + 4),aWVar2._8_4_);
                  auVar127._8_4_ = aWVar2._12_4_;
                  auVar127._12_4_ = *(undefined4 *)(av1_warped_filter[iVar85] + 6);
                  auVar137._8_8_ = auVar167._8_8_;
                  auVar137._0_8_ = auVar136._8_8_;
                  auVar156._8_8_ = auVar127._0_8_;
                  auVar156._0_8_ = auVar113._0_8_;
                  auVar150 = pmaddwd(auVar228,auVar188);
                  auVar6._16_16_ = auVar215;
                  auVar6._0_16_ = auVar188;
                  auVar134 = pmaddwd(auVar6._4_16_,auVar147);
                  auVar7._16_16_ = auVar215;
                  auVar7._0_16_ = auVar188;
                  auVar101 = pmaddwd(auVar7._8_16_,auVar174);
                  auVar8._16_16_ = auVar215;
                  auVar8._0_16_ = auVar188;
                  auVar140 = pmaddwd(auVar8._12_16_,auVar236);
                  auVar229._0_4_ =
                       auVar150._0_4_ + iVar94 + auVar134._0_4_ + auVar140._0_4_ + auVar101._0_4_ >>
                       auVar100;
                  auVar229._4_4_ =
                       auVar150._4_4_ + iVar94 + auVar134._4_4_ + auVar140._4_4_ + auVar101._4_4_ >>
                       auVar100;
                  auVar229._8_4_ =
                       auVar150._8_4_ + iVar94 + auVar134._8_4_ + auVar140._8_4_ + auVar101._8_4_ >>
                       auVar100;
                  auVar229._12_4_ =
                       auVar150._12_4_ + iVar94 + auVar134._12_4_ +
                       auVar140._12_4_ + auVar101._12_4_ >> auVar100;
                  auVar114._8_8_ = auVar127._8_8_;
                  auVar114._0_8_ = auVar113._8_8_;
                  auVar9._16_16_ = auVar215;
                  auVar9._0_16_ = auVar188;
                  auVar134 = pmaddwd(auVar9._2_16_,auVar103);
                  auVar10._16_16_ = auVar215;
                  auVar10._0_16_ = auVar188;
                  auVar101 = pmaddwd(auVar10._6_16_,auVar137);
                  auVar11._16_16_ = auVar215;
                  auVar11._0_16_ = auVar188;
                  auVar140 = pmaddwd(auVar11._10_16_,auVar156);
                  auVar12._16_16_ = auVar215;
                  auVar12._0_16_ = auVar188;
                  auVar150 = pmaddwd(auVar12._14_16_,auVar114);
                  auVar128._0_4_ =
                       auVar134._0_4_ + iVar94 + auVar140._0_4_ + auVar101._0_4_ + auVar150._0_4_ >>
                       auVar100;
                  auVar128._4_4_ =
                       auVar134._4_4_ + iVar94 + auVar140._4_4_ + auVar101._4_4_ + auVar150._4_4_ >>
                       auVar100;
                  auVar128._8_4_ =
                       auVar134._8_4_ + iVar94 + auVar140._8_4_ + auVar101._8_4_ + auVar150._8_4_ >>
                       auVar100;
                  auVar128._12_4_ =
                       auVar134._12_4_ + iVar94 + auVar140._12_4_ + auVar101._12_4_ +
                       auVar150._12_4_ >> auVar100;
                  auVar101 = packssdw(auVar229,auVar128);
                  *pauVar92 = auVar101;
                  lVar78 = lVar78 + 1;
                  iVar74 = iVar74 + iVar97;
                  pauVar92 = pauVar92 + 1;
                } while (lVar78 < lVar73);
              }
            }
            else {
              uVar89 = uVar76 + 0x10200;
              if (beta == 0 && alpha == 0) {
                if (-7 < iVar83) {
                  uVar70 = (ulong)(uVar89 >> 6 & 0xfffffff0);
                  uVar50 = *(undefined4 *)((long)av1_warped_filter[0] + uVar70);
                  uVar51 = *(undefined4 *)((long)av1_warped_filter[0] + uVar70 + 4);
                  uVar52 = *(undefined4 *)((long)av1_warped_filter[0] + uVar70 + 8);
                  uVar53 = *(undefined4 *)((long)av1_warped_filter[0] + uVar70 + 0xc);
                  auVar140._4_4_ = uVar50;
                  auVar140._0_4_ = uVar50;
                  auVar140._8_4_ = uVar50;
                  auVar140._12_4_ = uVar50;
                  auVar150._4_4_ = uVar51;
                  auVar150._0_4_ = uVar51;
                  auVar150._8_4_ = uVar51;
                  auVar150._12_4_ = uVar51;
                  auVar130._4_4_ = uVar52;
                  auVar130._0_4_ = uVar52;
                  auVar130._8_4_ = uVar52;
                  auVar130._12_4_ = uVar52;
                  auVar132._4_4_ = uVar53;
                  auVar132._0_4_ = uVar53;
                  auVar132._8_4_ = uVar53;
                  auVar132._12_4_ = uVar53;
                  lVar69 = (long)iVar77 + -7;
                  pauVar92 = &local_128;
                  lVar78 = lVar82;
                  do {
                    iVar77 = iVar64;
                    if (lVar69 < lVar95) {
                      iVar77 = (int)lVar69;
                    }
                    if (lVar69 < 0) {
                      iVar77 = 0;
                    }
                    auVar101 = *(undefined1 (*) [16])
                                ((long)ref +
                                (long)(iVar77 * stride) * 2 + ((ulong)(uint)(iVar90 * 2) - 0xe));
                    auVar134 = *(undefined1 (*) [16])
                                ((long)ref +
                                (long)(iVar77 * stride) * 2 + (ulong)(uint)(iVar90 * 2) + 2);
                    auVar20._16_16_ = auVar134;
                    auVar20._0_16_ = auVar101;
                    auVar21._16_16_ = auVar134;
                    auVar21._0_16_ = auVar101;
                    auVar159 = pmaddwd(auVar21._8_16_,auVar130);
                    auVar22._16_16_ = auVar134;
                    auVar22._0_16_ = auVar101;
                    auVar218 = pmaddwd(auVar22._12_16_,auVar132);
                    auVar23._16_16_ = auVar134;
                    auVar23._0_16_ = auVar101;
                    auVar24._16_16_ = auVar134;
                    auVar24._0_16_ = auVar101;
                    auVar25._16_16_ = auVar134;
                    auVar25._0_16_ = auVar101;
                    auVar181 = pmaddwd(auVar101,auVar140);
                    auVar161 = pmaddwd(auVar20._4_16_,auVar150);
                    auVar182._0_4_ =
                         auVar181._0_4_ + iVar94 + auVar161._0_4_ + auVar218._0_4_ + auVar159._0_4_
                         >> auVar100;
                    auVar182._4_4_ =
                         auVar181._4_4_ + iVar94 + auVar161._4_4_ + auVar218._4_4_ + auVar159._4_4_
                         >> auVar100;
                    auVar182._8_4_ =
                         auVar181._8_4_ + iVar94 + auVar161._8_4_ + auVar218._8_4_ + auVar159._8_4_
                         >> auVar100;
                    auVar182._12_4_ =
                         auVar181._12_4_ + iVar94 + auVar161._12_4_ +
                         auVar218._12_4_ + auVar159._12_4_ >> auVar100;
                    auVar26._16_16_ = auVar134;
                    auVar26._0_16_ = auVar101;
                    auVar134 = pmaddwd(auVar23._2_16_,auVar140);
                    auVar101 = pmaddwd(auVar24._6_16_,auVar150);
                    auVar161 = pmaddwd(auVar25._10_16_,auVar130);
                    auVar218 = pmaddwd(auVar26._14_16_,auVar132);
                    auVar159._0_4_ =
                         auVar134._0_4_ + iVar94 + auVar161._0_4_ + auVar101._0_4_ + auVar218._0_4_
                         >> auVar100;
                    auVar159._4_4_ =
                         auVar134._4_4_ + iVar94 + auVar161._4_4_ + auVar101._4_4_ + auVar218._4_4_
                         >> auVar100;
                    auVar159._8_4_ =
                         auVar134._8_4_ + iVar94 + auVar161._8_4_ + auVar101._8_4_ + auVar218._8_4_
                         >> auVar100;
                    auVar159._12_4_ =
                         auVar134._12_4_ + iVar94 + auVar161._12_4_ + auVar101._12_4_ +
                         auVar218._12_4_ >> auVar100;
                    auVar101 = packssdw(auVar182,auVar159);
                    *pauVar92 = auVar101;
                    pauVar92 = pauVar92 + 1;
                    lVar69 = lVar69 + 1;
                    lVar78 = lVar78 + -1;
                  } while (lVar78 != 0);
                }
              }
              else if (alpha != 0 || beta == 0) {
                if (alpha != 0 && beta == 0) {
                  if (-7 < iVar83) {
                    iVar74 = (int)(iVar98 + uVar89) >> 10;
                    uVar50 = *(undefined4 *)(av1_warped_filter[iVar74] + 4);
                    aWVar1 = av1_warped_filter[(int)(uVar89 + iVar47) >> 10];
                    iVar84 = (int)(uVar89 + iVar48) >> 10;
                    uVar52 = *(undefined4 *)(av1_warped_filter[iVar84] + 4);
                    iVar85 = (int)(uVar89 + iVar45) >> 10;
                    uVar51 = *(undefined4 *)(av1_warped_filter[iVar85] + 4);
                    auVar41._4_8_ = auVar165._8_8_;
                    auVar41._0_4_ = aWVar1._8_4_;
                    auVar166._0_8_ = auVar41._0_8_ << 0x20;
                    auVar166._8_4_ = *(undefined4 *)(av1_warped_filter[iVar74] + 6);
                    auVar166._12_4_ = aWVar1._12_4_;
                    auVar56._4_4_ = aWVar1._0_4_;
                    auVar56._0_4_ = *(undefined4 *)av1_warped_filter[iVar74];
                    auVar56._12_4_ = *(undefined4 *)av1_warped_filter[iVar85];
                    auVar56._8_4_ = *(undefined4 *)av1_warped_filter[iVar84];
                    auVar42._4_8_ = aWVar1._8_8_;
                    auVar42._0_4_ = aWVar1._0_4_;
                    auVar110._0_8_ = auVar42._0_8_ << 0x20;
                    auVar110._8_4_ = *(undefined4 *)(av1_warped_filter[iVar74] + 2);
                    auVar110._12_4_ = aWVar1._4_4_;
                    local_148._4_4_ = *(undefined4 *)(av1_warped_filter[iVar85] + 2);
                    local_148._0_4_ = *(undefined4 *)(av1_warped_filter[iVar84] + 2);
                    aWVar2 = av1_warped_filter[(int)uVar89 >> 10];
                    iVar84 = (int)(uVar89 + iVar49) >> 10;
                    auVar231._0_8_ =
                         CONCAT44(*(undefined4 *)(av1_warped_filter[iVar84] + 4),aWVar2._8_4_);
                    auVar231._8_4_ = aWVar2._12_4_;
                    auVar231._12_4_ = *(undefined4 *)(av1_warped_filter[iVar84] + 6);
                    aWVar3 = av1_warped_filter[(int)(uVar89 + iVar80) >> 10];
                    iVar74 = (int)(uVar89 + iVar46) >> 10;
                    auVar141._0_8_ =
                         CONCAT44(*(undefined4 *)(av1_warped_filter[iVar74] + 4),aWVar3._8_4_);
                    auVar141._8_4_ = aWVar3._12_4_;
                    auVar141._12_4_ = *(undefined4 *)(av1_warped_filter[iVar74] + 6);
                    auVar202._8_8_ = auVar141._8_8_;
                    auVar202._0_8_ = auVar231._8_8_;
                    auVar232._8_8_ = auVar141._0_8_;
                    auVar232._0_8_ = auVar231._0_8_;
                    auVar223._0_8_ = aWVar2._0_8_;
                    auVar223._8_4_ = aWVar2._4_4_;
                    auVar223._12_4_ = *(undefined4 *)(av1_warped_filter[iVar84] + 2);
                    auVar224._0_4_ = aWVar2._0_4_;
                    auVar224._4_4_ = *(undefined4 *)av1_warped_filter[iVar84];
                    auVar122._0_8_ = aWVar3._0_8_;
                    auVar122._8_4_ = aWVar3._4_4_;
                    auVar122._12_4_ = *(undefined4 *)(av1_warped_filter[iVar74] + 2);
                    auVar224._12_4_ = *(undefined4 *)av1_warped_filter[iVar74];
                    auVar224._8_4_ = aWVar3._0_4_;
                    auVar238._8_8_ = auVar122._8_8_;
                    auVar238._0_8_ = auVar223._8_8_;
                    lVar69 = (long)iVar77 + -7;
                    pauVar92 = &local_128;
                    lVar78 = lVar82;
                    do {
                      iVar77 = iVar64;
                      if (lVar69 < lVar95) {
                        iVar77 = (int)lVar69;
                      }
                      if (lVar69 < 0) {
                        iVar77 = 0;
                      }
                      auVar101 = *(undefined1 (*) [16])
                                  ((long)ref +
                                  (long)(iVar77 * stride) * 2 + ((ulong)(uint)(iVar90 * 2) - 0xe));
                      auVar134 = *(undefined1 (*) [16])
                                  ((long)ref +
                                  (long)(iVar77 * stride) * 2 + (ulong)(uint)(iVar90 * 2) + 2);
                      auVar27._16_16_ = auVar134;
                      auVar27._0_16_ = auVar101;
                      auVar28._16_16_ = auVar134;
                      auVar28._0_16_ = auVar101;
                      auVar140 = pmaddwd(auVar28._8_16_,auVar232);
                      auVar29._16_16_ = auVar134;
                      auVar29._0_16_ = auVar101;
                      auVar150 = pmaddwd(auVar29._12_16_,auVar202);
                      auVar30._16_16_ = auVar134;
                      auVar30._0_16_ = auVar101;
                      auVar31._16_16_ = auVar134;
                      auVar31._0_16_ = auVar101;
                      auVar32._16_16_ = auVar134;
                      auVar32._0_16_ = auVar101;
                      auVar132 = pmaddwd(auVar101,auVar224);
                      auVar130 = pmaddwd(auVar27._4_16_,auVar238);
                      auVar183._0_4_ =
                           auVar132._0_4_ + iVar94 + auVar130._0_4_ +
                           auVar150._0_4_ + auVar140._0_4_ >> auVar100;
                      auVar183._4_4_ =
                           auVar132._4_4_ + iVar94 + auVar130._4_4_ +
                           auVar150._4_4_ + auVar140._4_4_ >> auVar100;
                      auVar183._8_4_ =
                           auVar132._8_4_ + iVar94 + auVar130._8_4_ +
                           auVar150._8_4_ + auVar140._8_4_ >> auVar100;
                      auVar183._12_4_ =
                           auVar132._12_4_ + iVar94 + auVar130._12_4_ +
                           auVar150._12_4_ + auVar140._12_4_ >> auVar100;
                      auVar33._16_16_ = auVar134;
                      auVar33._0_16_ = auVar101;
                      auVar134 = pmaddwd(auVar30._2_16_,auVar56);
                      auVar61._8_8_ = uStack_150;
                      auVar61._0_8_ = auVar110._8_8_;
                      auVar101 = pmaddwd(auVar31._6_16_,auVar61);
                      auVar55._4_4_ = aWVar1._8_4_;
                      auVar55._0_4_ = uVar50;
                      auVar55._8_4_ = uVar52;
                      auVar55._12_4_ = uVar51;
                      auVar150 = pmaddwd(auVar32._10_16_,auVar55);
                      auVar54._8_8_ = uStack_230;
                      auVar54._0_8_ = auVar166._8_8_;
                      auVar140 = pmaddwd(auVar33._14_16_,auVar54);
                      auVar123._0_4_ =
                           auVar134._0_4_ + iVar94 + auVar150._0_4_ + auVar101._0_4_ +
                           auVar140._0_4_ >> auVar100;
                      auVar123._4_4_ =
                           auVar134._4_4_ + iVar94 + auVar150._4_4_ + auVar101._4_4_ +
                           auVar140._4_4_ >> auVar100;
                      auVar123._8_4_ =
                           auVar134._8_4_ + iVar94 + auVar150._8_4_ + auVar101._8_4_ +
                           auVar140._8_4_ >> auVar100;
                      auVar123._12_4_ =
                           auVar134._12_4_ + iVar94 + auVar150._12_4_ + auVar101._12_4_ +
                           auVar140._12_4_ >> auVar100;
                      auVar101 = packssdw(auVar183,auVar123);
                      *pauVar92 = auVar101;
                      pauVar92 = pauVar92 + 1;
                      lVar69 = lVar69 + 1;
                      lVar78 = lVar78 + -1;
                    } while (lVar78 != 0);
                  }
                }
                else if (-7 < iVar83) {
                  iVar74 = uVar76 + iVar66;
                  lVar69 = (long)iVar77 + -7;
                  pauVar92 = &local_128;
                  lVar78 = lVar82;
                  do {
                    iVar77 = iVar64;
                    if (lVar69 < lVar95) {
                      iVar77 = (int)lVar69;
                    }
                    if (lVar69 < 0) {
                      iVar77 = 0;
                    }
                    auVar101 = *(undefined1 (*) [16])
                                ((long)ref +
                                (long)(iVar77 * stride) * 2 + ((ulong)(uint)(iVar90 * 2) - 0xe));
                    auVar134 = *(undefined1 (*) [16])
                                ((long)ref +
                                (long)(iVar77 * stride) * 2 + (ulong)(uint)(iVar90 * 2) + 2);
                    aWVar1 = av1_warped_filter[iVar74 >> 10];
                    iVar77 = iVar49 + iVar74 >> 10;
                    aWVar2 = av1_warped_filter[iVar80 + iVar74 >> 10];
                    iVar84 = iVar46 + iVar74 >> 10;
                    aWVar3 = av1_warped_filter[iVar98 + iVar74 >> 10];
                    iVar85 = iVar47 + iVar74 >> 10;
                    aWVar4 = av1_warped_filter[iVar48 + iVar74 >> 10];
                    iVar144 = iVar45 + iVar74 >> 10;
                    auVar218._0_8_ = aWVar1._0_8_;
                    auVar218._8_4_ = aWVar1._4_4_;
                    auVar218._12_4_ = *(undefined4 *)(av1_warped_filter[iVar77] + 2);
                    auVar142._4_4_ = *(undefined4 *)av1_warped_filter[iVar77];
                    auVar142._0_4_ = aWVar1._0_4_;
                    auVar162._0_8_ = aWVar2._0_8_;
                    auVar162._8_4_ = aWVar2._4_4_;
                    auVar162._12_4_ = *(undefined4 *)(av1_warped_filter[iVar84] + 2);
                    auVar142._12_4_ = *(undefined4 *)av1_warped_filter[iVar84];
                    auVar142._8_4_ = aWVar2._0_4_;
                    auVar233._0_8_ =
                         CONCAT44(*(undefined4 *)(av1_warped_filter[iVar77] + 4),aWVar1._8_4_);
                    auVar233._8_4_ = aWVar1._12_4_;
                    auVar233._12_4_ = *(undefined4 *)(av1_warped_filter[iVar77] + 6);
                    auVar152._0_8_ =
                         CONCAT44(*(undefined4 *)(av1_warped_filter[iVar84] + 4),aWVar2._8_4_);
                    auVar152._8_4_ = aWVar2._12_4_;
                    auVar152._12_4_ = *(undefined4 *)(av1_warped_filter[iVar84] + 6);
                    auVar161._8_8_ = auVar162._8_8_;
                    auVar161._0_8_ = auVar218._8_8_;
                    auVar173._8_8_ = auVar152._0_8_;
                    auVar173._0_8_ = auVar233._0_8_;
                    auVar234._8_8_ = auVar152._8_8_;
                    auVar234._0_8_ = auVar233._8_8_;
                    auVar153._0_8_ = aWVar3._0_8_;
                    auVar153._8_4_ = aWVar3._4_4_;
                    auVar153._12_4_ = *(undefined4 *)(av1_warped_filter[iVar85] + 2);
                    auVar163._4_4_ = *(undefined4 *)av1_warped_filter[iVar85];
                    auVar163._0_4_ = aWVar3._0_4_;
                    auVar184._0_8_ = aWVar4._0_8_;
                    auVar184._8_4_ = aWVar4._4_4_;
                    auVar184._12_4_ = *(undefined4 *)(av1_warped_filter[iVar144] + 2);
                    auVar163._12_4_ = *(undefined4 *)av1_warped_filter[iVar144];
                    auVar163._8_4_ = aWVar4._0_4_;
                    auVar239._0_8_ =
                         CONCAT44(*(undefined4 *)(av1_warped_filter[iVar85] + 4),aWVar3._8_4_);
                    auVar239._8_4_ = aWVar3._12_4_;
                    auVar239._12_4_ = *(undefined4 *)(av1_warped_filter[iVar85] + 6);
                    auVar164._0_8_ =
                         CONCAT44(*(undefined4 *)(av1_warped_filter[iVar144] + 4),aWVar4._8_4_);
                    auVar164._8_4_ = aWVar4._12_4_;
                    auVar164._12_4_ = *(undefined4 *)(av1_warped_filter[iVar144] + 6);
                    auVar154._8_8_ = auVar184._8_8_;
                    auVar154._0_8_ = auVar153._8_8_;
                    auVar124._8_8_ = auVar164._0_8_;
                    auVar124._0_8_ = auVar239._0_8_;
                    auVar130 = pmaddwd(auVar142,auVar101);
                    auVar34._16_16_ = auVar134;
                    auVar34._0_16_ = auVar101;
                    auVar150 = pmaddwd(auVar34._4_16_,auVar161);
                    auVar35._16_16_ = auVar134;
                    auVar35._0_16_ = auVar101;
                    auVar140 = pmaddwd(auVar35._8_16_,auVar173);
                    auVar36._16_16_ = auVar134;
                    auVar36._0_16_ = auVar101;
                    auVar132 = pmaddwd(auVar36._12_16_,auVar234);
                    auVar143._0_4_ =
                         auVar130._0_4_ + iVar94 + auVar150._0_4_ + auVar132._0_4_ + auVar140._0_4_
                         >> auVar100;
                    auVar143._4_4_ =
                         auVar130._4_4_ + iVar94 + auVar150._4_4_ + auVar132._4_4_ + auVar140._4_4_
                         >> auVar100;
                    auVar143._8_4_ =
                         auVar130._8_4_ + iVar94 + auVar150._8_4_ + auVar132._8_4_ + auVar140._8_4_
                         >> auVar100;
                    auVar143._12_4_ =
                         auVar130._12_4_ + iVar94 + auVar150._12_4_ +
                         auVar132._12_4_ + auVar140._12_4_ >> auVar100;
                    auVar240._8_8_ = auVar164._8_8_;
                    auVar240._0_8_ = auVar239._8_8_;
                    auVar37._16_16_ = auVar134;
                    auVar37._0_16_ = auVar101;
                    auVar140 = pmaddwd(auVar37._2_16_,auVar163);
                    auVar38._16_16_ = auVar134;
                    auVar38._0_16_ = auVar101;
                    auVar150 = pmaddwd(auVar38._6_16_,auVar154);
                    auVar39._16_16_ = auVar134;
                    auVar39._0_16_ = auVar101;
                    auVar130 = pmaddwd(auVar39._10_16_,auVar124);
                    auVar40._16_16_ = auVar134;
                    auVar40._0_16_ = auVar101;
                    auVar101 = pmaddwd(auVar40._14_16_,auVar240);
                    auVar181._0_4_ =
                         auVar140._0_4_ + iVar94 + auVar130._0_4_ + auVar150._0_4_ + auVar101._0_4_
                         >> auVar100;
                    auVar181._4_4_ =
                         auVar140._4_4_ + iVar94 + auVar130._4_4_ + auVar150._4_4_ + auVar101._4_4_
                         >> auVar100;
                    auVar181._8_4_ =
                         auVar140._8_4_ + iVar94 + auVar130._8_4_ + auVar150._8_4_ + auVar101._8_4_
                         >> auVar100;
                    auVar181._12_4_ =
                         auVar140._12_4_ + iVar94 + auVar130._12_4_ + auVar150._12_4_ +
                         auVar101._12_4_ >> auVar100;
                    auVar101 = packssdw(auVar143,auVar181);
                    *pauVar92 = auVar101;
                    pauVar92 = pauVar92 + 1;
                    iVar74 = iVar74 + iVar97;
                    lVar69 = lVar69 + 1;
                    lVar78 = lVar78 + -1;
                  } while (lVar78 != 0);
                }
              }
              else if (-7 < iVar83) {
                iVar74 = uVar76 + iVar66;
                lVar69 = (long)iVar77 + -7;
                pauVar92 = &local_128;
                lVar78 = lVar82;
                do {
                  iVar77 = iVar64;
                  if (lVar69 < lVar95) {
                    iVar77 = (int)lVar69;
                  }
                  if (lVar69 < 0) {
                    iVar77 = 0;
                  }
                  auVar101 = *(undefined1 (*) [16])
                              ((long)ref +
                              (long)(iVar77 * stride) * 2 + ((ulong)(uint)(iVar90 * 2) - 0xe));
                  auVar134 = *(undefined1 (*) [16])
                              ((long)ref +
                              (long)(iVar77 * stride) * 2 + (ulong)(uint)(iVar90 * 2) + 2);
                  iVar77 = iVar74 >> 10;
                  uVar50 = *(undefined4 *)av1_warped_filter[iVar77];
                  uVar51 = *(undefined4 *)(av1_warped_filter[iVar77] + 2);
                  uVar52 = *(undefined4 *)(av1_warped_filter[iVar77] + 4);
                  uVar53 = *(undefined4 *)(av1_warped_filter[iVar77] + 6);
                  auVar180._4_4_ = uVar50;
                  auVar180._0_4_ = uVar50;
                  auVar180._8_4_ = uVar50;
                  auVar180._12_4_ = uVar50;
                  auVar201._4_4_ = uVar51;
                  auVar201._0_4_ = uVar51;
                  auVar201._8_4_ = uVar51;
                  auVar201._12_4_ = uVar51;
                  auVar222._4_4_ = uVar52;
                  auVar222._0_4_ = uVar52;
                  auVar222._8_4_ = uVar52;
                  auVar222._12_4_ = uVar52;
                  auVar151._4_4_ = uVar53;
                  auVar151._0_4_ = uVar53;
                  auVar151._8_4_ = uVar53;
                  auVar151._12_4_ = uVar53;
                  auVar13._16_16_ = auVar134;
                  auVar13._0_16_ = auVar101;
                  auVar14._16_16_ = auVar134;
                  auVar14._0_16_ = auVar101;
                  auVar150 = pmaddwd(auVar14._8_16_,auVar222);
                  auVar15._16_16_ = auVar134;
                  auVar15._0_16_ = auVar101;
                  auVar140 = pmaddwd(auVar15._12_16_,auVar151);
                  auVar16._16_16_ = auVar134;
                  auVar16._0_16_ = auVar101;
                  auVar17._16_16_ = auVar134;
                  auVar17._0_16_ = auVar101;
                  auVar18._16_16_ = auVar134;
                  auVar18._0_16_ = auVar101;
                  auVar19._16_16_ = auVar134;
                  auVar19._0_16_ = auVar101;
                  auVar134 = pmaddwd(auVar101,auVar180);
                  auVar101 = pmaddwd(auVar13._4_16_,auVar201);
                  auVar172._0_4_ =
                       auVar134._0_4_ + iVar94 + auVar101._0_4_ + auVar140._0_4_ + auVar150._0_4_ >>
                       auVar100;
                  auVar172._4_4_ =
                       auVar134._4_4_ + iVar94 + auVar101._4_4_ + auVar140._4_4_ + auVar150._4_4_ >>
                       auVar100;
                  auVar172._8_4_ =
                       auVar134._8_4_ + iVar94 + auVar101._8_4_ + auVar140._8_4_ + auVar150._8_4_ >>
                       auVar100;
                  auVar172._12_4_ =
                       auVar134._12_4_ + iVar94 + auVar101._12_4_ +
                       auVar140._12_4_ + auVar150._12_4_ >> auVar100;
                  auVar140 = pmaddwd(auVar16._2_16_,auVar180);
                  auVar101 = pmaddwd(auVar17._6_16_,auVar201);
                  auVar150 = pmaddwd(auVar18._10_16_,auVar222);
                  auVar134 = pmaddwd(auVar19._14_16_,auVar151);
                  auVar160._0_4_ =
                       auVar140._0_4_ + iVar94 + auVar150._0_4_ + auVar101._0_4_ + auVar134._0_4_ >>
                       auVar100;
                  auVar160._4_4_ =
                       auVar140._4_4_ + iVar94 + auVar150._4_4_ + auVar101._4_4_ + auVar134._4_4_ >>
                       auVar100;
                  auVar160._8_4_ =
                       auVar140._8_4_ + iVar94 + auVar150._8_4_ + auVar101._8_4_ + auVar134._8_4_ >>
                       auVar100;
                  auVar160._12_4_ =
                       auVar140._12_4_ + iVar94 + auVar150._12_4_ + auVar101._12_4_ +
                       auVar134._12_4_ >> auVar100;
                  auVar101 = packssdw(auVar172,auVar160);
                  *pauVar92 = auVar101;
                  pauVar92 = pauVar92 + 1;
                  iVar74 = iVar74 + iVar97;
                  lVar69 = lVar69 + 1;
                  lVar78 = lVar78 + -1;
                } while (lVar78 != 0);
              }
            }
          }
          else if (-7 < iVar83) {
            lVar78 = -7;
            pauVar92 = &local_128;
            do {
              iVar90 = iVar77 + (int)lVar78;
              if (lVar95 <= iVar77 + lVar78) {
                iVar90 = iVar64;
              }
              if (iVar77 + lVar78 < 0) {
                iVar90 = 0;
              }
              auVar101 = ZEXT416(((uint)ref[iVar90 * stride + width + -1] << (7 - bVar44 & 0x1f)) +
                                 iVar87);
              auVar101 = pshuflw(auVar101,auVar101,0);
              auVar134._0_4_ = auVar101._0_4_;
              auVar134._4_4_ = auVar134._0_4_;
              auVar134._8_4_ = auVar134._0_4_;
              auVar134._12_4_ = auVar134._0_4_;
              *pauVar92 = auVar134;
              lVar78 = lVar78 + 1;
              pauVar92 = pauVar92 + 1;
            } while (lVar78 < lVar73);
          }
          if (0 < iVar83) {
            iVar74 = (((uint)lVar91 & 0xfffc) + (delta + iVar75) * -4 & 0xffffffc0) + 0x10200;
            lVar91 = -4;
            puVar96 = local_b8;
            iVar77 = local_2f4;
            iVar90 = iVar86;
            do {
              auVar101 = *(undefined1 (*) [16])(puVar96 + -0x38);
              auVar134 = *(undefined1 (*) [16])(puVar96 + -0x28);
              auVar171._0_12_ = auVar101._0_12_;
              auVar171._12_2_ = auVar101._6_2_;
              auVar171._14_2_ = puVar96[-0x2d];
              auVar170._12_4_ = auVar171._12_4_;
              auVar170._0_10_ = auVar101._0_10_;
              auVar170._10_2_ = puVar96[-0x2e];
              auVar169._10_6_ = auVar170._10_6_;
              auVar169._0_8_ = auVar101._0_8_;
              auVar169._8_2_ = auVar101._4_2_;
              auVar168._8_8_ = auVar169._8_8_;
              auVar168._6_2_ = puVar96[-0x2f];
              auVar168._4_2_ = auVar101._2_2_;
              auVar168._0_2_ = auVar101._0_2_;
              auVar168._2_2_ = puVar96[-0x30];
              auVar178._0_12_ = auVar134._0_12_;
              auVar178._12_2_ = auVar134._6_2_;
              auVar178._14_2_ = puVar96[-0x1d];
              auVar177._12_4_ = auVar178._12_4_;
              auVar177._0_10_ = auVar134._0_10_;
              auVar177._10_2_ = puVar96[-0x1e];
              auVar176._10_6_ = auVar177._10_6_;
              auVar176._0_8_ = auVar134._0_8_;
              auVar176._8_2_ = auVar134._4_2_;
              auVar175._8_8_ = auVar176._8_8_;
              auVar175._6_2_ = puVar96[-0x1f];
              auVar175._4_2_ = auVar134._2_2_;
              auVar175._0_2_ = auVar134._0_2_;
              auVar175._2_2_ = puVar96[-0x20];
              auVar140 = *(undefined1 (*) [16])(puVar96 + -0x18);
              aWVar1 = av1_warped_filter[iVar74 >> 10];
              iVar84 = iVar75 * 2 + iVar74 >> 10;
              aWVar2 = av1_warped_filter[iVar75 * 4 + iVar74 >> 10];
              iVar85 = iVar75 * 6 + iVar74 >> 10;
              auVar157._0_8_ = aWVar1._0_8_;
              auVar157._8_4_ = aWVar1._4_4_;
              auVar157._12_4_ = *(undefined4 *)(av1_warped_filter[iVar84] + 2);
              auVar129._4_4_ = *(undefined4 *)av1_warped_filter[iVar84];
              auVar129._0_4_ = aWVar1._0_4_;
              auVar216._0_8_ = CONCAT44(*(undefined4 *)(av1_warped_filter[iVar84] + 4),aWVar1._8_4_)
              ;
              auVar216._8_4_ = aWVar1._12_4_;
              auVar216._12_4_ = *(undefined4 *)(av1_warped_filter[iVar84] + 6);
              auVar104._0_8_ = aWVar2._0_8_;
              auVar104._8_4_ = aWVar2._4_4_;
              auVar104._12_4_ = *(undefined4 *)(av1_warped_filter[iVar85] + 2);
              auVar129._12_4_ = *(undefined4 *)av1_warped_filter[iVar85];
              auVar129._8_4_ = aWVar2._0_4_;
              auVar115._0_8_ = CONCAT44(*(undefined4 *)(av1_warped_filter[iVar85] + 4),aWVar2._8_4_)
              ;
              auVar115._8_4_ = aWVar2._12_4_;
              auVar115._12_4_ = *(undefined4 *)(av1_warped_filter[iVar85] + 6);
              auVar130 = pmaddwd(auVar129,auVar168);
              auVar158._8_8_ = auVar104._8_8_;
              auVar158._0_8_ = auVar157._8_8_;
              auVar108._0_12_ = auVar140._0_12_;
              auVar108._12_2_ = auVar140._6_2_;
              auVar108._14_2_ = puVar96[-0xd];
              auVar107._12_4_ = auVar108._12_4_;
              auVar107._0_10_ = auVar140._0_10_;
              auVar107._10_2_ = puVar96[-0xe];
              auVar106._10_6_ = auVar107._10_6_;
              auVar106._0_8_ = auVar140._0_8_;
              auVar106._8_2_ = auVar140._4_2_;
              auVar105._8_8_ = auVar106._8_8_;
              auVar105._6_2_ = puVar96[-0xf];
              auVar105._4_2_ = auVar140._2_2_;
              auVar105._0_2_ = auVar140._0_2_;
              auVar105._2_2_ = puVar96[-0x10];
              auVar159 = pmaddwd(auVar158,auVar175);
              auVar150 = *(undefined1 (*) [16])(puVar96 + -8);
              auVar131._8_8_ = auVar115._0_8_;
              auVar131._0_8_ = auVar216._0_8_;
              auVar132 = pmaddwd(auVar131,auVar105);
              auVar217._8_8_ = auVar115._8_8_;
              auVar217._0_8_ = auVar216._8_8_;
              auVar119._0_12_ = auVar150._0_12_;
              auVar119._12_2_ = auVar150._6_2_;
              auVar119._14_2_ = puVar96[3];
              auVar118._12_4_ = auVar119._12_4_;
              auVar118._0_10_ = auVar150._0_10_;
              auVar118._10_2_ = puVar96[2];
              auVar117._10_6_ = auVar118._10_6_;
              auVar117._0_8_ = auVar150._0_8_;
              auVar117._8_2_ = auVar150._4_2_;
              auVar116._8_8_ = auVar117._8_8_;
              auVar116._6_2_ = puVar96[1];
              auVar116._4_2_ = auVar150._2_2_;
              auVar116._0_2_ = auVar150._0_2_;
              auVar116._2_2_ = *puVar96;
              auVar218 = pmaddwd(auVar217,auVar116);
              iVar213 = auVar218._0_4_ + auVar132._0_4_ + auVar159._0_4_ + auVar130._0_4_;
              iVar225 = auVar218._4_4_ + auVar132._4_4_ + auVar159._4_4_ + auVar130._4_4_;
              iVar226 = auVar218._8_4_ + auVar132._8_4_ + auVar159._8_4_ + auVar130._8_4_;
              iVar227 = auVar218._12_4_ + auVar132._12_4_ + auVar159._12_4_ + auVar130._12_4_;
              auVar237._2_2_ = puVar96[-0x2c];
              auVar237._0_2_ = auVar101._8_2_;
              auVar237._4_2_ = auVar101._10_2_;
              auVar237._6_2_ = puVar96[-0x2b];
              auVar237._8_2_ = auVar101._12_2_;
              auVar237._10_2_ = puVar96[-0x2a];
              auVar237._12_2_ = auVar101._14_2_;
              auVar237._14_2_ = puVar96[-0x29];
              auVar196._2_2_ = puVar96[-0x1c];
              auVar196._0_2_ = auVar134._8_2_;
              auVar196._4_2_ = auVar134._10_2_;
              auVar196._6_2_ = puVar96[-0x1b];
              auVar196._8_2_ = auVar134._12_2_;
              auVar196._10_2_ = puVar96[-0x1a];
              auVar196._12_2_ = auVar134._14_2_;
              auVar196._14_2_ = puVar96[-0x19];
              auVar230._2_2_ = puVar96[-0xc];
              auVar230._0_2_ = auVar140._8_2_;
              auVar230._4_2_ = auVar140._10_2_;
              auVar230._6_2_ = puVar96[-0xb];
              auVar230._8_2_ = auVar140._12_2_;
              auVar230._10_2_ = puVar96[-10];
              auVar230._12_2_ = auVar140._14_2_;
              auVar230._14_2_ = puVar96[-9];
              auVar179._2_2_ = puVar96[4];
              auVar179._0_2_ = auVar150._8_2_;
              auVar179._4_2_ = auVar150._10_2_;
              auVar179._6_2_ = puVar96[5];
              auVar179._8_2_ = auVar150._12_2_;
              auVar179._10_2_ = puVar96[6];
              auVar179._12_2_ = auVar150._14_2_;
              auVar179._14_2_ = puVar96[7];
              aWVar1 = av1_warped_filter[iVar74 + iVar75 >> 10];
              iVar84 = iVar75 * 3 + iVar74 >> 10;
              aWVar2 = av1_warped_filter[iVar75 * 5 + iVar74 >> 10];
              iVar85 = iVar75 * 7 + iVar74 >> 10;
              auVar148._0_8_ = aWVar1._0_8_;
              auVar148._8_4_ = aWVar1._4_4_;
              auVar148._12_4_ = *(undefined4 *)(av1_warped_filter[iVar84] + 2);
              auVar133._4_4_ = *(undefined4 *)av1_warped_filter[iVar84];
              auVar133._0_4_ = aWVar1._0_4_;
              auVar138._0_8_ = CONCAT44(*(undefined4 *)(av1_warped_filter[iVar84] + 4),aWVar1._8_4_)
              ;
              auVar138._8_4_ = aWVar1._12_4_;
              auVar138._12_4_ = *(undefined4 *)(av1_warped_filter[iVar84] + 6);
              auVar120._0_8_ = aWVar2._0_8_;
              auVar120._8_4_ = aWVar2._4_4_;
              auVar120._12_4_ = *(undefined4 *)(av1_warped_filter[iVar85] + 2);
              auVar133._12_4_ = *(undefined4 *)av1_warped_filter[iVar85];
              auVar133._8_4_ = aWVar2._0_4_;
              auVar109._0_8_ = CONCAT44(*(undefined4 *)(av1_warped_filter[iVar85] + 4),aWVar2._8_4_)
              ;
              auVar109._8_4_ = aWVar2._12_4_;
              auVar109._12_4_ = *(undefined4 *)(av1_warped_filter[iVar85] + 6);
              auVar134 = pmaddwd(auVar133,auVar237);
              auVar149._8_8_ = auVar120._8_8_;
              auVar149._0_8_ = auVar148._8_8_;
              auVar150 = pmaddwd(auVar149,auVar196);
              auVar121._8_8_ = auVar109._0_8_;
              auVar121._0_8_ = auVar138._0_8_;
              auVar101 = pmaddwd(auVar121,auVar230);
              auVar139._8_8_ = auVar109._8_8_;
              auVar139._0_8_ = auVar138._8_8_;
              auVar140 = pmaddwd(auVar139,auVar179);
              iVar84 = auVar140._0_4_ + auVar101._0_4_ + auVar150._0_4_ + auVar134._0_4_;
              iVar85 = auVar140._4_4_ + auVar101._4_4_ + auVar150._4_4_ + auVar134._4_4_;
              iVar144 = auVar140._8_4_ + auVar101._8_4_ + auVar150._8_4_ + auVar134._8_4_;
              iVar145 = auVar140._12_4_ + auVar101._12_4_ + auVar150._12_4_ + auVar134._12_4_;
              if (conv_params->is_compound == 0) {
                auVar198._0_4_ = iVar213 + iVar79 >> auVar125;
                auVar198._4_4_ = iVar84 + iVar79 >> auVar125;
                auVar198._8_4_ = iVar225 + iVar79 >> auVar125;
                auVar198._12_4_ = iVar85 + iVar79 >> auVar125;
                auVar219._0_4_ = iVar226 + iVar79 >> auVar125;
                auVar219._4_4_ = iVar144 + iVar79 >> auVar125;
                auVar219._8_4_ = iVar227 + iVar79 >> auVar125;
                auVar219._12_4_ = iVar145 + iVar79 >> auVar125;
                auVar101 = packssdw(auVar198,auVar219);
                sVar186 = auVar101._0_2_;
                uVar185 = (ushort)((short)local_148._0_2_ < sVar186) * local_148._0_2_ |
                          (ushort)((short)local_148._0_2_ >= sVar186) * sVar186;
                sVar186 = auVar101._2_2_;
                uVar203 = (ushort)((short)local_148._2_2_ < sVar186) * local_148._2_2_ |
                          (ushort)((short)local_148._2_2_ >= sVar186) * sVar186;
                sVar186 = auVar101._4_2_;
                uVar205 = (ushort)((short)local_148._4_2_ < sVar186) * local_148._4_2_ |
                          (ushort)((short)local_148._4_2_ >= sVar186) * sVar186;
                sVar186 = auVar101._6_2_;
                uVar207 = (ushort)((short)local_148._6_2_ < sVar186) * local_148._6_2_ |
                          (ushort)((short)local_148._6_2_ >= sVar186) * sVar186;
                sVar186 = auVar101._8_2_;
                uVar209 = (ushort)((short)local_148._8_2_ < sVar186) * local_148._8_2_ |
                          (ushort)((short)local_148._8_2_ >= sVar186) * sVar186;
                sVar186 = auVar101._10_2_;
                uVar210 = (ushort)((short)local_148._10_2_ < sVar186) * local_148._10_2_ |
                          (ushort)((short)local_148._10_2_ >= sVar186) * sVar186;
                sVar186 = auVar101._12_2_;
                sVar204 = auVar101._14_2_;
                uVar211 = (ushort)((short)local_148._12_2_ < sVar186) * local_148._12_2_ |
                          (ushort)((short)local_148._12_2_ >= sVar186) * sVar186;
                uVar212 = (ushort)((short)local_148._14_2_ < sVar204) * local_148._14_2_ |
                          (ushort)((short)local_148._14_2_ >= sVar204) * sVar204;
                auVar199._0_8_ =
                     CONCAT26((-1 < (short)uVar207) * uVar207,
                              CONCAT24((-1 < (short)uVar205) * uVar205,
                                       CONCAT22((-1 < (short)uVar203) * uVar203,
                                                (-1 < (short)uVar185) * uVar185)));
                auVar199._8_2_ = (-1 < (short)uVar209) * uVar209;
                auVar199._10_2_ = (-1 < (short)uVar210) * uVar210;
                auVar199._12_2_ = (-1 < (short)uVar211) * uVar211;
                auVar199._14_2_ = (-1 < (short)uVar212) * uVar212;
                if (p_width == 4) {
                  *(undefined8 *)(pred + iVar77) = auVar199._0_8_;
                }
                else {
                  *(undefined1 (*) [16])(pred + iVar77) = auVar199;
                }
              }
              else {
                auVar197._0_4_ = iVar213 + iVar72 >> auVar125;
                auVar197._4_4_ = iVar84 + iVar72 >> auVar125;
                auVar197._8_4_ = iVar225 + iVar72 >> auVar125;
                auVar197._12_4_ = iVar85 + iVar72 >> auVar125;
                puVar93 = conv_params->dst + (conv_params->dst_stride * iVar90 + iVar88);
                local_178 = auVar126._0_2_;
                sStack_176 = auVar126._2_2_;
                if (conv_params->do_average == 0) {
                  auVar101 = packusdw(auVar197,auVar197);
                  uVar187 = auVar101._0_8_;
                }
                else {
                  auVar109 = pmovzxwd(auVar109,*(undefined8 *)puVar93);
                  if (conv_params->use_dist_wtd_comp_avg == 0) {
                    iVar84 = auVar197._0_4_ + auVar109._0_4_ >> 1;
                    iVar85 = auVar197._4_4_ + auVar109._4_4_ >> 1;
                    iVar213 = auVar197._8_4_ + auVar109._8_4_ >> 1;
                    iVar225 = auVar197._12_4_ + auVar109._12_4_ >> 1;
                  }
                  else {
                    auVar59._4_4_ = iVar71;
                    auVar59._0_4_ = iVar71;
                    auVar59._8_4_ = iVar71;
                    auVar59._12_4_ = iVar71;
                    auVar109 = pmulld(auVar109,auVar59);
                    auVar57._4_4_ = iVar5;
                    auVar57._0_4_ = iVar5;
                    auVar57._8_4_ = iVar5;
                    auVar57._12_4_ = iVar5;
                    auVar101 = pmulld(auVar197,auVar57);
                    iVar84 = auVar101._0_4_ + auVar109._0_4_ >> 4;
                    iVar85 = auVar101._4_4_ + auVar109._4_4_ >> 4;
                    iVar213 = auVar101._8_4_ + auVar109._8_4_ >> 4;
                    iVar225 = auVar101._12_4_ + auVar109._12_4_ >> 4;
                  }
                  puVar93 = pred + iVar77;
                  auVar200._0_4_ = iVar84 + iVar135 >> auVar99;
                  auVar200._4_4_ = iVar85 + iVar135 >> auVar99;
                  auVar200._8_4_ = iVar213 + iVar135 >> auVar99;
                  auVar200._12_4_ = iVar225 + iVar135 >> auVar99;
                  auVar101 = packusdw(auVar200,auVar200);
                  sVar186 = auVar101._0_2_;
                  sVar204 = auVar101._2_2_;
                  sVar206 = auVar101._4_2_;
                  sVar208 = auVar101._6_2_;
                  uVar187 = CONCAT26((ushort)(sStack_176 < sVar208) * sStack_176 |
                                     (ushort)(sStack_176 >= sVar208) * sVar208,
                                     CONCAT24((ushort)(local_178 < sVar206) * local_178 |
                                              (ushort)(local_178 >= sVar206) * sVar206,
                                              CONCAT22((ushort)(sStack_176 < sVar204) * sStack_176 |
                                                       (ushort)(sStack_176 >= sVar204) * sVar204,
                                                       (ushort)(local_178 < sVar186) * local_178 |
                                                       (ushort)(local_178 >= sVar186) * sVar186)));
                }
                *(undefined8 *)puVar93 = uVar187;
                if (4 < p_width) {
                  lVar78 = (long)(conv_params->dst_stride * iVar90 + iVar88);
                  auVar220._0_4_ = iVar226 + iVar72 >> auVar125;
                  auVar220._4_4_ = iVar144 + iVar72 >> auVar125;
                  auVar220._8_4_ = iVar227 + iVar72 >> auVar125;
                  auVar220._12_4_ = iVar145 + iVar72 >> auVar125;
                  if (conv_params->do_average == 0) {
                    auVar101 = packusdw(auVar220,auVar220);
                    *(long *)(conv_params->dst + lVar78 + 4) = auVar101._0_8_;
                  }
                  else {
                    auVar101 = pmovzxwd(auVar109,*(undefined8 *)(conv_params->dst + lVar78 + 4));
                    if (conv_params->use_dist_wtd_comp_avg == 0) {
                      iVar84 = auVar220._0_4_ + auVar101._0_4_ >> 1;
                      iVar85 = auVar220._4_4_ + auVar101._4_4_ >> 1;
                      iVar144 = auVar220._8_4_ + auVar101._8_4_ >> 1;
                      iVar145 = auVar220._12_4_ + auVar101._12_4_ >> 1;
                    }
                    else {
                      auVar60._4_4_ = iVar71;
                      auVar60._0_4_ = iVar71;
                      auVar60._8_4_ = iVar71;
                      auVar60._12_4_ = iVar71;
                      auVar101 = pmulld(auVar101,auVar60);
                      auVar58._4_4_ = iVar5;
                      auVar58._0_4_ = iVar5;
                      auVar58._8_4_ = iVar5;
                      auVar58._12_4_ = iVar5;
                      auVar134 = pmulld(auVar220,auVar58);
                      iVar84 = auVar134._0_4_ + auVar101._0_4_ >> 4;
                      iVar85 = auVar134._4_4_ + auVar101._4_4_ >> 4;
                      iVar144 = auVar134._8_4_ + auVar101._8_4_ >> 4;
                      iVar145 = auVar134._12_4_ + auVar101._12_4_ >> 4;
                    }
                    auVar221._0_4_ = iVar84 + iVar135 >> auVar99;
                    auVar221._4_4_ = iVar85 + iVar135 >> auVar99;
                    auVar221._8_4_ = iVar144 + iVar135 >> auVar99;
                    auVar221._12_4_ = iVar145 + iVar135 >> auVar99;
                    auVar101 = packusdw(auVar221,auVar221);
                    sVar186 = auVar101._0_2_;
                    sVar204 = auVar101._2_2_;
                    sVar206 = auVar101._4_2_;
                    sVar208 = auVar101._6_2_;
                    *(ulong *)(pred + (long)iVar77 + 4) =
                         CONCAT26((ushort)(sStack_176 < sVar208) * sStack_176 |
                                  (ushort)(sStack_176 >= sVar208) * sVar208,
                                  CONCAT24((ushort)(local_178 < sVar206) * local_178 |
                                           (ushort)(local_178 >= sVar206) * sVar206,
                                           CONCAT22((ushort)(sStack_176 < sVar204) * sStack_176 |
                                                    (ushort)(sStack_176 >= sVar204) * sVar204,
                                                    (ushort)(local_178 < sVar186) * local_178 |
                                                    (ushort)(local_178 >= sVar186) * sVar186)));
                  }
                }
              }
              lVar91 = lVar91 + 1;
              puVar96 = puVar96 + 8;
              iVar74 = iVar74 + delta;
              iVar77 = iVar77 + p_stride;
              iVar90 = iVar90 + 1;
            } while (lVar91 < iVar67 + -4);
          }
          iVar88 = iVar88 + 8;
          local_2f4 = local_2f4 + 8;
        } while (iVar88 < p_width);
      }
      iVar86 = iVar86 + 8;
      iVar81 = iVar81 + -8;
      local_318 = local_318 + p_stride * 8;
    } while (iVar86 < p_height);
  }
  return;
}

Assistant:

void av1_highbd_warp_affine_sse4_1(const int32_t *mat, const uint16_t *ref,
                                   int width, int height, int stride,
                                   uint16_t *pred, int p_col, int p_row,
                                   int p_width, int p_height, int p_stride,
                                   int subsampling_x, int subsampling_y, int bd,
                                   ConvolveParams *conv_params, int16_t alpha,
                                   int16_t beta, int16_t gamma, int16_t delta) {
  __m128i tmp[15];
  int i, j, k;
  const int reduce_bits_horiz = conv_params->round_0;
  const int reduce_bits_vert = conv_params->is_compound
                                   ? conv_params->round_1
                                   : 2 * FILTER_BITS - reduce_bits_horiz;
  const int offset_bits_horiz = bd + FILTER_BITS - 1;
  assert(IMPLIES(conv_params->is_compound, conv_params->dst != NULL));
  assert(!(bd == 12 && reduce_bits_horiz < 5));
  assert(IMPLIES(conv_params->do_average, conv_params->is_compound));

  // Check that, even with 12-bit input, the intermediate values will fit
  // into an unsigned 16-bit intermediate array.
  assert(bd + FILTER_BITS + 2 - conv_params->round_0 <= 16);

  const int offset_bits_vert = bd + 2 * FILTER_BITS - reduce_bits_horiz;
  const __m128i clip_pixel =
      _mm_set1_epi16(bd == 10 ? 1023 : (bd == 12 ? 4095 : 255));
  const __m128i reduce_bits_vert_shift = _mm_cvtsi32_si128(reduce_bits_vert);
  const __m128i reduce_bits_vert_const =
      _mm_set1_epi32(((1 << reduce_bits_vert) >> 1));
  const __m128i res_add_const = _mm_set1_epi32(1 << offset_bits_vert);
  const int round_bits =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const int offset_bits = bd + 2 * FILTER_BITS - conv_params->round_0;
  const __m128i res_sub_const =
      _mm_set1_epi32(-(1 << (offset_bits - conv_params->round_1)) -
                     (1 << (offset_bits - conv_params->round_1 - 1)));
  __m128i round_bits_shift = _mm_cvtsi32_si128(round_bits);
  __m128i round_bits_const = _mm_set1_epi32(((1 << round_bits) >> 1));

  const int w0 = conv_params->fwd_offset;
  const int w1 = conv_params->bck_offset;
  const __m128i wt0 = _mm_set1_epi32(w0);
  const __m128i wt1 = _mm_set1_epi32(w1);

  /* Note: For this code to work, the left/right frame borders need to be
  extended by at least 13 pixels each. By the time we get here, other
  code will have set up this border, but we allow an explicit check
  for debugging purposes.
  */
  /*for (i = 0; i < height; ++i) {
  for (j = 0; j < 13; ++j) {
  assert(ref[i * stride - 13 + j] == ref[i * stride]);
  assert(ref[i * stride + width + j] == ref[i * stride + (width - 1)]);
  }
  }*/

  for (i = 0; i < p_height; i += 8) {
    for (j = 0; j < p_width; j += 8) {
      const int32_t src_x = (p_col + j + 4) << subsampling_x;
      const int32_t src_y = (p_row + i + 4) << subsampling_y;
      const int64_t dst_x =
          (int64_t)mat[2] * src_x + (int64_t)mat[3] * src_y + (int64_t)mat[0];
      const int64_t dst_y =
          (int64_t)mat[4] * src_x + (int64_t)mat[5] * src_y + (int64_t)mat[1];
      const int64_t x4 = dst_x >> subsampling_x;
      const int64_t y4 = dst_y >> subsampling_y;

      int32_t ix4 = (int32_t)(x4 >> WARPEDMODEL_PREC_BITS);
      int32_t sx4 = x4 & ((1 << WARPEDMODEL_PREC_BITS) - 1);
      int32_t iy4 = (int32_t)(y4 >> WARPEDMODEL_PREC_BITS);
      int32_t sy4 = y4 & ((1 << WARPEDMODEL_PREC_BITS) - 1);

      // Add in all the constant terms, including rounding and offset
      sx4 += alpha * (-4) + beta * (-4) + (1 << (WARPEDDIFF_PREC_BITS - 1)) +
             (WARPEDPIXEL_PREC_SHIFTS << WARPEDDIFF_PREC_BITS);
      sy4 += gamma * (-4) + delta * (-4) + (1 << (WARPEDDIFF_PREC_BITS - 1)) +
             (WARPEDPIXEL_PREC_SHIFTS << WARPEDDIFF_PREC_BITS);

      sx4 &= ~((1 << WARP_PARAM_REDUCE_BITS) - 1);
      sy4 &= ~((1 << WARP_PARAM_REDUCE_BITS) - 1);

      // Horizontal filter
      // If the block is aligned such that, after clamping, every sample
      // would be taken from the leftmost/rightmost column, then we can
      // skip the expensive horizontal filter.
      if (ix4 <= -7) {
        for (k = -7; k < AOMMIN(8, p_height - i); ++k) {
          int iy = iy4 + k;
          if (iy < 0)
            iy = 0;
          else if (iy > height - 1)
            iy = height - 1;
          tmp[k + 7] = _mm_set1_epi16(
              (1 << (bd + FILTER_BITS - reduce_bits_horiz - 1)) +
              ref[iy * stride] * (1 << (FILTER_BITS - reduce_bits_horiz)));
        }
      } else if (ix4 >= width + 6) {
        for (k = -7; k < AOMMIN(8, p_height - i); ++k) {
          int iy = iy4 + k;
          if (iy < 0)
            iy = 0;
          else if (iy > height - 1)
            iy = height - 1;
          tmp[k + 7] =
              _mm_set1_epi16((1 << (bd + FILTER_BITS - reduce_bits_horiz - 1)) +
                             ref[iy * stride + (width - 1)] *
                                 (1 << (FILTER_BITS - reduce_bits_horiz)));
        }
      } else if (((ix4 - 7) < 0) || ((ix4 + 9) > width)) {
        const int out_of_boundary_left = -(ix4 - 6);
        const int out_of_boundary_right = (ix4 + 8) - width;

        for (k = -7; k < AOMMIN(8, p_height - i); ++k) {
          int iy = iy4 + k;
          if (iy < 0)
            iy = 0;
          else if (iy > height - 1)
            iy = height - 1;
          int sx = sx4 + beta * (k + 4);

          // Load source pixels
          const __m128i src =
              _mm_loadu_si128((__m128i *)(ref + iy * stride + ix4 - 7));
          const __m128i src2 =
              _mm_loadu_si128((__m128i *)(ref + iy * stride + ix4 + 1));

          const __m128i src_01 = _mm_shuffle_epi8(
              src, _mm_loadu_si128((__m128i *)warp_highbd_arrange_bytes));
          const __m128i src2_01 = _mm_shuffle_epi8(
              src2, _mm_loadu_si128((__m128i *)warp_highbd_arrange_bytes));

          __m128i src_lo = _mm_unpacklo_epi64(src_01, src2_01);
          __m128i src_hi = _mm_unpackhi_epi64(src_01, src2_01);

          if (out_of_boundary_left >= 0) {
            const __m128i shuffle_reg_left =
                _mm_loadu_si128((__m128i *)warp_pad_left[out_of_boundary_left]);
            src_lo = _mm_shuffle_epi8(src_lo, shuffle_reg_left);
            src_hi = _mm_shuffle_epi8(src_hi, shuffle_reg_left);
          }

          if (out_of_boundary_right >= 0) {
            const __m128i shuffle_reg_right = _mm_loadu_si128(
                (__m128i *)warp_pad_right[out_of_boundary_right]);
            src_lo = _mm_shuffle_epi8(src_lo, shuffle_reg_right);
            src_hi = _mm_shuffle_epi8(src_hi, shuffle_reg_right);
          }

          const __m128i src_padded = _mm_unpacklo_epi8(src_lo, src_hi);
          const __m128i src2_padded = _mm_unpackhi_epi8(src_lo, src_hi);

          highbd_horiz_filter(&src_padded, &src2_padded, tmp, sx, alpha, k,
                              offset_bits_horiz, reduce_bits_horiz);
        }
      } else {
        highbd_prepare_warp_horizontal_filter(
            ref, tmp, stride, ix4, iy4, sx4, alpha, beta, p_height, height, i,
            offset_bits_horiz, reduce_bits_horiz);
      }

      // Vertical filter
      for (k = -4; k < AOMMIN(4, p_height - i - 4); ++k) {
        int sy = sy4 + delta * (k + 4);

        // Load from tmp and rearrange pairs of consecutive rows into the
        // column order 0 0 2 2 4 4 6 6; 1 1 3 3 5 5 7 7
        const __m128i *src = tmp + (k + 4);
        const __m128i src_0 = _mm_unpacklo_epi16(src[0], src[1]);
        const __m128i src_2 = _mm_unpacklo_epi16(src[2], src[3]);
        const __m128i src_4 = _mm_unpacklo_epi16(src[4], src[5]);
        const __m128i src_6 = _mm_unpacklo_epi16(src[6], src[7]);

        // Filter even-index pixels
        const __m128i tmp_0 = _mm_loadu_si128(
            (__m128i *)(av1_warped_filter +
                        ((sy + 0 * gamma) >> WARPEDDIFF_PREC_BITS)));
        const __m128i tmp_2 = _mm_loadu_si128(
            (__m128i *)(av1_warped_filter +
                        ((sy + 2 * gamma) >> WARPEDDIFF_PREC_BITS)));
        const __m128i tmp_4 = _mm_loadu_si128(
            (__m128i *)(av1_warped_filter +
                        ((sy + 4 * gamma) >> WARPEDDIFF_PREC_BITS)));
        const __m128i tmp_6 = _mm_loadu_si128(
            (__m128i *)(av1_warped_filter +
                        ((sy + 6 * gamma) >> WARPEDDIFF_PREC_BITS)));

        const __m128i tmp_8 = _mm_unpacklo_epi32(tmp_0, tmp_2);
        const __m128i tmp_10 = _mm_unpacklo_epi32(tmp_4, tmp_6);
        const __m128i tmp_12 = _mm_unpackhi_epi32(tmp_0, tmp_2);
        const __m128i tmp_14 = _mm_unpackhi_epi32(tmp_4, tmp_6);

        const __m128i coeff_0 = _mm_unpacklo_epi64(tmp_8, tmp_10);
        const __m128i coeff_2 = _mm_unpackhi_epi64(tmp_8, tmp_10);
        const __m128i coeff_4 = _mm_unpacklo_epi64(tmp_12, tmp_14);
        const __m128i coeff_6 = _mm_unpackhi_epi64(tmp_12, tmp_14);

        const __m128i res_0 = _mm_madd_epi16(src_0, coeff_0);
        const __m128i res_2 = _mm_madd_epi16(src_2, coeff_2);
        const __m128i res_4 = _mm_madd_epi16(src_4, coeff_4);
        const __m128i res_6 = _mm_madd_epi16(src_6, coeff_6);

        const __m128i res_even = _mm_add_epi32(_mm_add_epi32(res_0, res_2),
                                               _mm_add_epi32(res_4, res_6));

        // Filter odd-index pixels
        const __m128i src_1 = _mm_unpackhi_epi16(src[0], src[1]);
        const __m128i src_3 = _mm_unpackhi_epi16(src[2], src[3]);
        const __m128i src_5 = _mm_unpackhi_epi16(src[4], src[5]);
        const __m128i src_7 = _mm_unpackhi_epi16(src[6], src[7]);

        const __m128i tmp_1 = _mm_loadu_si128(
            (__m128i *)(av1_warped_filter +
                        ((sy + 1 * gamma) >> WARPEDDIFF_PREC_BITS)));
        const __m128i tmp_3 = _mm_loadu_si128(
            (__m128i *)(av1_warped_filter +
                        ((sy + 3 * gamma) >> WARPEDDIFF_PREC_BITS)));
        const __m128i tmp_5 = _mm_loadu_si128(
            (__m128i *)(av1_warped_filter +
                        ((sy + 5 * gamma) >> WARPEDDIFF_PREC_BITS)));
        const __m128i tmp_7 = _mm_loadu_si128(
            (__m128i *)(av1_warped_filter +
                        ((sy + 7 * gamma) >> WARPEDDIFF_PREC_BITS)));

        const __m128i tmp_9 = _mm_unpacklo_epi32(tmp_1, tmp_3);
        const __m128i tmp_11 = _mm_unpacklo_epi32(tmp_5, tmp_7);
        const __m128i tmp_13 = _mm_unpackhi_epi32(tmp_1, tmp_3);
        const __m128i tmp_15 = _mm_unpackhi_epi32(tmp_5, tmp_7);

        const __m128i coeff_1 = _mm_unpacklo_epi64(tmp_9, tmp_11);
        const __m128i coeff_3 = _mm_unpackhi_epi64(tmp_9, tmp_11);
        const __m128i coeff_5 = _mm_unpacklo_epi64(tmp_13, tmp_15);
        const __m128i coeff_7 = _mm_unpackhi_epi64(tmp_13, tmp_15);

        const __m128i res_1 = _mm_madd_epi16(src_1, coeff_1);
        const __m128i res_3 = _mm_madd_epi16(src_3, coeff_3);
        const __m128i res_5 = _mm_madd_epi16(src_5, coeff_5);
        const __m128i res_7 = _mm_madd_epi16(src_7, coeff_7);

        const __m128i res_odd = _mm_add_epi32(_mm_add_epi32(res_1, res_3),
                                              _mm_add_epi32(res_5, res_7));

        // Rearrange pixels back into the order 0 ... 7
        __m128i res_lo = _mm_unpacklo_epi32(res_even, res_odd);
        __m128i res_hi = _mm_unpackhi_epi32(res_even, res_odd);

        if (conv_params->is_compound) {
          __m128i *const p =
              (__m128i *)&conv_params
                  ->dst[(i + k + 4) * conv_params->dst_stride + j];
          res_lo = _mm_add_epi32(res_lo, res_add_const);
          res_lo = _mm_sra_epi32(_mm_add_epi32(res_lo, reduce_bits_vert_const),
                                 reduce_bits_vert_shift);

          if (conv_params->do_average) {
            __m128i *const dst16 = (__m128i *)&pred[(i + k + 4) * p_stride + j];
            __m128i p_32 = _mm_cvtepu16_epi32(_mm_loadl_epi64(p));

            if (conv_params->use_dist_wtd_comp_avg) {
              res_lo = _mm_add_epi32(_mm_mullo_epi32(p_32, wt0),
                                     _mm_mullo_epi32(res_lo, wt1));
              res_lo = _mm_srai_epi32(res_lo, DIST_PRECISION_BITS);
            } else {
              res_lo = _mm_srai_epi32(_mm_add_epi32(p_32, res_lo), 1);
            }

            __m128i res32_lo = _mm_add_epi32(res_lo, res_sub_const);
            res32_lo = _mm_sra_epi32(_mm_add_epi32(res32_lo, round_bits_const),
                                     round_bits_shift);

            __m128i res16_lo = _mm_packus_epi32(res32_lo, res32_lo);
            res16_lo = _mm_min_epi16(res16_lo, clip_pixel);
            _mm_storel_epi64(dst16, res16_lo);
          } else {
            res_lo = _mm_packus_epi32(res_lo, res_lo);
            _mm_storel_epi64(p, res_lo);
          }
          if (p_width > 4) {
            __m128i *const p4 =
                (__m128i *)&conv_params
                    ->dst[(i + k + 4) * conv_params->dst_stride + j + 4];

            res_hi = _mm_add_epi32(res_hi, res_add_const);
            res_hi =
                _mm_sra_epi32(_mm_add_epi32(res_hi, reduce_bits_vert_const),
                              reduce_bits_vert_shift);
            if (conv_params->do_average) {
              __m128i *const dst16_4 =
                  (__m128i *)&pred[(i + k + 4) * p_stride + j + 4];
              __m128i p4_32 = _mm_cvtepu16_epi32(_mm_loadl_epi64(p4));

              if (conv_params->use_dist_wtd_comp_avg) {
                res_hi = _mm_add_epi32(_mm_mullo_epi32(p4_32, wt0),
                                       _mm_mullo_epi32(res_hi, wt1));
                res_hi = _mm_srai_epi32(res_hi, DIST_PRECISION_BITS);
              } else {
                res_hi = _mm_srai_epi32(_mm_add_epi32(p4_32, res_hi), 1);
              }

              __m128i res32_hi = _mm_add_epi32(res_hi, res_sub_const);
              res32_hi = _mm_sra_epi32(
                  _mm_add_epi32(res32_hi, round_bits_const), round_bits_shift);
              __m128i res16_hi = _mm_packus_epi32(res32_hi, res32_hi);
              res16_hi = _mm_min_epi16(res16_hi, clip_pixel);
              _mm_storel_epi64(dst16_4, res16_hi);
            } else {
              res_hi = _mm_packus_epi32(res_hi, res_hi);
              _mm_storel_epi64(p4, res_hi);
            }
          }
        } else {
          // Round and pack into 8 bits
          const __m128i round_const =
              _mm_set1_epi32(-(1 << (bd + reduce_bits_vert - 1)) +
                             ((1 << reduce_bits_vert) >> 1));

          const __m128i res_lo_round = _mm_srai_epi32(
              _mm_add_epi32(res_lo, round_const), reduce_bits_vert);
          const __m128i res_hi_round = _mm_srai_epi32(
              _mm_add_epi32(res_hi, round_const), reduce_bits_vert);

          __m128i res_16bit = _mm_packs_epi32(res_lo_round, res_hi_round);
          // Clamp res_16bit to the range [0, 2^bd - 1]
          const __m128i max_val = _mm_set1_epi16((1 << bd) - 1);
          const __m128i zero = _mm_setzero_si128();
          res_16bit = _mm_max_epi16(_mm_min_epi16(res_16bit, max_val), zero);

          // Store, blending with 'pred' if needed
          __m128i *const p = (__m128i *)&pred[(i + k + 4) * p_stride + j];

          // Note: If we're outputting a 4x4 block, we need to be very careful
          // to only output 4 pixels at this point, to avoid encode/decode
          // mismatches when encoding with multiple threads.
          if (p_width == 4) {
            _mm_storel_epi64(p, res_16bit);
          } else {
            _mm_storeu_si128(p, res_16bit);
          }
        }
      }
    }
  }
}